

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeOneofFields
          (MessageGenerator *this,Printer *printer,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields,bool to_array)

{
  FieldDescriptor *pFVar1;
  LogMessage *other;
  pointer ppFVar2;
  FieldGenerator *pFVar3;
  ulong uVar4;
  string local_88;
  LogMessage local_68;
  
  if ((fields->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (fields->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
               ,0xde0);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: !fields.empty(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_88,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  ppFVar2 = (fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pFVar1 = *ppFVar2;
  if ((long)(fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2 == 8) {
    GenerateSerializeOneField(this,printer,pFVar1,to_array,-1);
  }
  else {
    io::Printer::Print(printer,"switch ($oneofname$_case()) {\n","oneofname",
                       (string *)**(undefined8 **)(pFVar1 + 0x60));
    io::Printer::Indent(printer);
    ppFVar2 = (fields->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((fields->
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_finish != ppFVar2) {
      uVar4 = 0;
      do {
        pFVar1 = ppFVar2[uVar4];
        UnderscoresToCamelCase(&local_88,*(string **)pFVar1,true);
        io::Printer::Print(printer,"case k$field_name$:\n","field_name",&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        io::Printer::Indent(printer);
        pFVar3 = FieldGeneratorMap::get(&this->field_generators_,pFVar1);
        (*pFVar3->_vptr_FieldGenerator[(ulong)to_array + 0x15])(pFVar3,printer);
        io::Printer::Print(printer,"break;\n");
        io::Printer::Outdent(printer);
        uVar4 = uVar4 + 1;
        ppFVar2 = (fields->
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar4 < (ulong)((long)(fields->
                                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2 >>
                              3));
    }
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"  default: ;\n}\n");
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSerializeOneofFields(
    io::Printer* printer, const std::vector<const FieldDescriptor*>& fields,
    bool to_array) {
  GOOGLE_CHECK(!fields.empty());
  if (fields.size() == 1) {
    GenerateSerializeOneField(printer, fields[0], to_array, -1);
    return;
  }
  // We have multiple mutually exclusive choices.  Emit a switch statement.
  const OneofDescriptor* oneof = fields[0]->containing_oneof();
  printer->Print(
    "switch ($oneofname$_case()) {\n",
    "oneofname", oneof->name());
  printer->Indent();
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];
    printer->Print(
      "case k$field_name$:\n",
      "field_name", UnderscoresToCamelCase(field->name(), true));
    printer->Indent();
    if (to_array) {
      field_generators_.get(field).GenerateSerializeWithCachedSizesToArray(
          printer);
    } else {
      field_generators_.get(field).GenerateSerializeWithCachedSizes(printer);
    }
    printer->Print(
      "break;\n");
    printer->Outdent();
  }
  printer->Outdent();
  // Doing nothing is an option.
  printer->Print(
    "  default: ;\n"
    "}\n");
}